

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void Init_ADPCMATable(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  piVar2 = jedi_table;
  lVar3 = 0;
  do {
    iVar1 = steps[lVar3];
    uVar4 = 0;
    uVar5 = 0;
    do {
      iVar6 = ((uVar4 & 0xe) + 1) * iVar1;
      iVar7 = iVar6 + 7;
      if (-1 < iVar6) {
        iVar7 = iVar6;
      }
      iVar6 = -(iVar7 >> 3);
      if (uVar5 < 8) {
        iVar6 = iVar7 >> 3;
      }
      piVar2[uVar5] = iVar6;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 2;
    } while (uVar5 != 0x10);
    lVar3 = lVar3 + 1;
    piVar2 = piVar2 + 0x10;
  } while (lVar3 != 0x31);
  return;
}

Assistant:

static void Init_ADPCMATable(void)
{
	int step, nib;

	for (step = 0; step < 49; step++)
	{
		/* loop over all nibbles and compute the difference */
		for (nib = 0; nib < 16; nib++)
		{
			int value = (2*(nib & 0x07) + 1) * steps[step] / 8;
			jedi_table[step*16 + nib] = (nib&0x08) ? -value : value;
		}
	}
}